

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O0

void __thiscall FPalette::SetPalette(FPalette *this,BYTE *colors)

{
  int iVar1;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_20;
  int local_1c;
  BYTE *pBStack_18;
  int i;
  BYTE *colors_local;
  FPalette *this_local;
  
  pBStack_18 = colors;
  colors_local = (BYTE *)this;
  for (local_1c = 0; local_1c < 0x100; local_1c = local_1c + 1) {
    PalEntry::PalEntry((PalEntry *)&local_20.field_0,*pBStack_18,pBStack_18[1],pBStack_18[2]);
    this->BaseColors[local_1c].field_0 = local_20;
    this->Remap[local_1c] = (BYTE)local_1c;
    pBStack_18 = pBStack_18 + 3;
  }
  iVar1 = BestColor((uint32 *)this,0xff,0xff,0xff,0,0xff);
  this->WhiteIndex = (BYTE)iVar1;
  iVar1 = BestColor((uint32 *)this,0,0,0,0,0xff);
  this->BlackIndex = (BYTE)iVar1;
  return;
}

Assistant:

void FPalette::SetPalette (const BYTE *colors)
{
	for (int i = 0; i < 256; i++, colors += 3)
	{
		BaseColors[i] = PalEntry (colors[0], colors[1], colors[2]);
		Remap[i] = i;
	}

	// Find white and black from the original palette so that they can be
	// used to make an educated guess of the translucency % for a BOOM
	// translucency map.
	WhiteIndex = BestColor ((DWORD *)BaseColors, 255, 255, 255, 0, 255);
	BlackIndex = BestColor ((DWORD *)BaseColors, 0, 0, 0, 0, 255);
}